

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# N.cpp
# Opt level: O0

CoAlg<string> *
coalg::decode_pattern
          (NS *g,map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_N_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_N_*>_>_>
                 *chrs)

{
  anon_class_56_2_d7007016 *in_RDI;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_N_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_N_*>_>_>
  *in_stack_ffffffffffffff88;
  anon_class_56_2_d7007016 *__f;
  function<N_*(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  *in_stack_ffffffffffffffa0;
  
  __f = in_RDI;
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_N_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_N_*>_>_>
  ::map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_N_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_N_*>_>_>
         *)in_RDI,in_stack_ffffffffffffff88);
  std::function<N*(std::__cxx11::string&)>::
  function<coalg::decode_pattern(NS*,std::map<std::__cxx11::string,N*,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,N*>>>&)::__0,void>
            (in_stack_ffffffffffffffa0,__f);
  decode_pattern(NS*,std::map<std::__cxx11::string,N*,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,N*>>>&)
  ::$_0::~__0((anon_class_56_2_d7007016 *)0x18cd54);
  return (CoAlg<string> *)in_RDI;
}

Assistant:

CoAlg<string> decode_pattern(NS* g, map<std::string, N*>& chrs) {
        return [g, chrs](string& p){
            if (p.empty()) return new(g) N("");
            else if (std::isalnum(p[0])) {
                const auto c = string(1, p[0]);
                auto cur = new(g) N("term-" + c);
                cur->connect(chrs.at(c), {new (g) N(p.substr(1))});
                return cur;
            } else if (p[0] == '.') {
                auto cur = new(g) N("any");
                for (auto& [c, n] : chrs)
                    cur->connect(n, {new (g) N(p.substr(1))});
                return cur;
            } else if (p[0] == '(' and p.find(')') != string::npos) {
                auto k = p.find_first_of(')');
                auto cur = new(g) N("group-" + p.substr(1, k - 1));
                return cur;
            } else {
                return new (g) N("Error");
            }
        };
    }